

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::TestHugeFieldNumbersLite::_InternalSerialize
          (TestHugeFieldNumbersLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *pRVar1;
  int *piVar2;
  ForeignMessageLite *value;
  MessageLite *value_00;
  void *data;
  unique_ptr<const_void_*[],_std::default_delete<const_void_*[]>_> uVar3;
  uint uVar4;
  int iVar5;
  const_reference piVar6;
  undefined8 *puVar7;
  int *piVar8;
  ulong uVar9;
  byte *extraout_RAX;
  byte *pbVar10;
  EpsCopyOutputStream *in_RCX;
  EpsCopyOutputStream *pEVar11;
  ulong uVar12;
  char *pcVar13;
  size_t sVar14;
  uint32_t uVar15;
  long *plVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  TestHugeFieldNumbersLite *pTVar20;
  byte *pbVar21;
  bool bVar22;
  string_view s;
  string_view s_00;
  string_view s_01;
  MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    in_RCX = stream;
    target = google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_TestHugeFieldNumbersLite_default_instance_,target,stream);
  }
  uVar19 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar19 & 0x10) == 0) goto LAB_001cd746;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  in_RCX = (EpsCopyOutputStream *)(long)(this->field_0)._impl_.optional_int32_;
  pbVar10 = target + 5;
  target[0] = 0x80;
  target[1] = 199;
  target[2] = 0xff;
  target[3] = 0xff;
  target[4] = 0xf;
  pEVar11 = in_RCX;
  if ((EpsCopyOutputStream *)0x7f < in_RCX) goto LAB_001cdc08;
  while( true ) {
    *pbVar10 = (byte)in_RCX;
    target = pbVar10 + 1;
LAB_001cd746:
    if ((uVar19 & 0x20) != 0) {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      in_RCX = (EpsCopyOutputStream *)(long)(this->field_0)._impl_.fixed_32_;
      pbVar10 = target + 5;
      target[0] = 0x88;
      target[1] = 199;
      target[2] = 0xff;
      target[3] = 0xff;
      target[4] = 0xf;
      pEVar11 = in_RCX;
      if ((EpsCopyOutputStream *)0x7f < in_RCX) {
        do {
          *pbVar10 = (byte)pEVar11 | 0x80;
          in_RCX = (EpsCopyOutputStream *)((ulong)pEVar11 >> 7);
          pbVar10 = pbVar10 + 1;
          bVar22 = (EpsCopyOutputStream *)0x3fff < pEVar11;
          pEVar11 = in_RCX;
        } while (bVar22);
      }
      *pbVar10 = (byte)in_RCX;
      target = pbVar10 + 1;
    }
    pRVar1 = &(this->field_0)._impl_.repeated_int32_;
    uVar4 = google::protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x20) & 4) == 0);
    pTVar20 = this;
    if (0 < (int)uVar4) {
      pTVar20 = (TestHugeFieldNumbersLite *)0x0;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        piVar6 = google::protobuf::RepeatedField<int>::Get(pRVar1,(int)pTVar20);
        in_RCX = (EpsCopyOutputStream *)(long)*piVar6;
        pbVar10 = target + 5;
        target[0] = 0x90;
        target[1] = 199;
        target[2] = 0xff;
        target[3] = 0xff;
        target[4] = 0xf;
        pEVar11 = in_RCX;
        if ((EpsCopyOutputStream *)0x7f < in_RCX) {
          do {
            *pbVar10 = (byte)pEVar11 | 0x80;
            in_RCX = (EpsCopyOutputStream *)((ulong)pEVar11 >> 7);
            pbVar10 = pbVar10 + 1;
            bVar22 = (EpsCopyOutputStream *)0x3fff < pEVar11;
            pEVar11 = in_RCX;
          } while (bVar22);
        }
        *pbVar10 = (byte)in_RCX;
        target = pbVar10 + 1;
        uVar18 = (int)pTVar20 + 1;
        pTVar20 = (TestHugeFieldNumbersLite *)(ulong)uVar18;
      } while (uVar18 != uVar4);
    }
    uVar4 = *(uint *)((long)&this->field_0 + 0x40);
    if ((int)uVar4 < 1) goto LAB_001cd888;
    pbVar10 = stream->end_;
    if (pbVar10 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar10 = stream->end_;
    }
    if (target < pbVar10) break;
    _InternalSerialize();
    pbVar10 = extraout_RAX;
    pEVar11 = in_RCX;
    this = pTVar20;
    uVar19 = uVar4;
LAB_001cdc08:
    do {
      *pbVar10 = (byte)pEVar11 | 0x80;
      in_RCX = (EpsCopyOutputStream *)((ulong)pEVar11 >> 7);
      pbVar10 = pbVar10 + 1;
      bVar22 = (EpsCopyOutputStream *)0x3fff < pEVar11;
      pEVar11 = in_RCX;
    } while (bVar22);
  }
  pRVar1 = &(this->field_0)._impl_.packed_int32_;
  target[0] = 0x9a;
  target[1] = 199;
  target[2] = 0xff;
  target[3] = 0xff;
  target[4] = 0xf;
  pbVar10 = target + 5;
  uVar18 = uVar4;
  if (uVar4 < 0x80) {
    pbVar21 = target + 4;
  }
  else {
    do {
      pbVar21 = pbVar10;
      *pbVar21 = (byte)uVar18 | 0x80;
      uVar4 = uVar18 >> 7;
      pbVar10 = pbVar21 + 1;
      bVar22 = 0x3fff < uVar18;
      uVar18 = uVar4;
    } while (bVar22);
  }
  *pbVar10 = (byte)uVar4;
  if ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    piVar8 = (int *)((long)&this->field_0 + 0x38);
    bVar22 = true;
  }
  else {
    piVar8 = (int *)google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
    bVar22 = (undefined1  [16])
             ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) ==
             (undefined1  [16])0x0;
  }
  target = pbVar21 + 2;
  iVar5 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar22);
  piVar2 = piVar8 + iVar5;
  do {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar12 = (ulong)*piVar8;
    uVar9 = uVar12;
    if (0x7f < uVar12) {
      do {
        *target = (byte)uVar9 | 0x80;
        uVar12 = uVar9 >> 7;
        target = target + 1;
        bVar22 = 0x3fff < uVar9;
        uVar9 = uVar12;
      } while (bVar22);
    }
    piVar8 = piVar8 + 1;
    *target = (byte)uVar12;
    target = target + 1;
  } while (piVar8 < piVar2);
LAB_001cd888:
  if ((uVar19 & 0x40) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar12 = (ulong)(this->field_0)._impl_.optional_enum_;
    pbVar10 = target + 5;
    target[0] = 0xa0;
    target[1] = 199;
    target[2] = 0xff;
    target[3] = 0xff;
    target[4] = 0xf;
    uVar9 = uVar12;
    if (0x7f < uVar12) {
      do {
        *pbVar10 = (byte)uVar9 | 0x80;
        uVar12 = uVar9 >> 7;
        pbVar10 = pbVar10 + 1;
        bVar22 = 0x3fff < uVar9;
        uVar9 = uVar12;
      } while (bVar22);
    }
    *pbVar10 = (byte)uVar12;
    target = pbVar10 + 1;
  }
  if ((uVar19 & 1) != 0) {
    puVar7 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    s._M_str = (char *)*puVar7;
    s._M_len = puVar7[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x1ffffc75,s,target);
  }
  if ((uVar19 & 2) != 0) {
    puVar7 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    s_00._M_str = (char *)*puVar7;
    s_00._M_len = puVar7[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x1ffffc76,s_00,target);
  }
  if ((uVar19 & 4) != 0) {
    value = (this->field_0)._impl_.optional_message_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x1ffffc77,&value->super_MessageLite,*(int *)((long)&value->field_0 + 4),
                        target,stream);
  }
  if ((uVar19 & 8) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    target = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                       (0x1ffffc78,&((this->field_0)._impl_.optionalgroup_)->super_MessageLite,
                        target,stream);
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x48);
  if (iVar5 != 0) {
    if ((iVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar19 = *(uint *)((long)&this->field_0 + 0x50);
      uVar9 = (ulong)uVar19;
      if (uVar19 != *(uint *)((long)&this->field_0 + 0x4c)) {
        plVar16 = *(long **)(*(long *)((long)&this->field_0 + 0x58) + uVar9 * 8);
        if (plVar16 == (long *)0x0) {
          google::protobuf::internal::protobuf_assumption_failed
                    ("node != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                     ,0x22e);
        }
        do {
          do {
            target = google::protobuf::internal::
                     MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                     ::InternalSerialize(0x1ffffc7a,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(plVar16 + 1),
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(plVar16 + 5),target,stream);
            plVar16 = (long *)*plVar16;
          } while (plVar16 != (long *)0x0);
          do {
            uVar19 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar19;
            if (*(uint *)((long)&this->field_0 + 0x4c) <= uVar19) goto LAB_001cd9e7;
            plVar16 = *(long **)(*(long *)((long)&this->field_0 + 0x58) + (ulong)uVar19 * 8);
          } while (plVar16 == (long *)0x0);
        } while( true );
      }
    }
    else {
      google::protobuf::internal::
      MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterPtr(&local_40,
                     (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&(this->field_0)._impl_.string_string_map_);
      uVar3._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           local_40.items_._M_t.
           super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
           super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
           super__Head_base<0UL,_const_void_**,_false>._M_head_impl;
      if (local_40.size_ != 0) {
        lVar17 = 0;
        do {
          target = google::protobuf::internal::
                   MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                   ::InternalSerialize(0x1ffffc7a,
                                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         **)((long)uVar3._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                                  .super__Head_base<0UL,_const_void_**,_false>.
                                                  _M_head_impl + lVar17),
                                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         **)((long)uVar3._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                                  .super__Head_base<0UL,_const_void_**,_false>.
                                                  _M_head_impl + lVar17) + 1,target,stream);
          lVar17 = lVar17 + 8;
        } while (local_40.size_ << 3 != lVar17);
      }
      if ((_Head_base<0UL,_const_void_**,_false>)
          local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (_Head_base<0UL,_const_void_**,_false>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
LAB_001cd9e7:
  switch((this->field_0)._impl_._oneof_case_[0]) {
  case 0x1ffffc7b:
    if (target < stream->end_) {
      uVar19 = *(uint *)((long)&this->field_0 + 0x98);
      target[0] = 0xd8;
      target[1] = 199;
      target[2] = 0xff;
      target[3] = 0xff;
LAB_001cda23:
      target[4] = 0xf;
      pbVar10 = target + 5;
      if (uVar19 < 0x80) {
        uVar9 = (ulong)uVar19;
      }
      else {
        uVar9 = (ulong)uVar19;
        do {
          *pbVar10 = (byte)uVar19 | 0x80;
          uVar9 = uVar9 >> 7;
          pbVar10 = pbVar10 + 1;
          bVar22 = 0x3fff < uVar19;
          uVar19 = (uint)uVar9;
        } while (bVar22);
      }
    }
    else {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar19 = *(uint *)((long)&this->field_0 + 0x98);
      uVar15 = (this->field_0)._impl_._oneof_case_[0];
      target[0] = 0xd8;
      target[1] = 199;
      target[2] = 0xff;
      target[3] = 0xff;
      if (uVar15 == 0x1ffffc7b) goto LAB_001cda23;
      target[4] = 0xf;
      pbVar10 = target + 5;
      uVar9 = 0;
    }
    *pbVar10 = (byte)uVar9;
    target = pbVar10 + 1;
    break;
  case 0x1ffffc7c:
    value_00 = *(MessageLite **)((long)&this->field_0 + 0x98);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x1ffffc7c,value_00,(int)value_00[1]._internal_metadata_.ptr_,target,stream)
    ;
    break;
  case 0x1ffffc7d:
    puVar7 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.oneof_field_.oneof_test_all_types_ & 0xfffffffffffffffc)
    ;
    pcVar13 = (char *)*puVar7;
    sVar14 = puVar7[1];
    uVar15 = 0x1ffffc7d;
    goto LAB_001cdafe;
  case 0x1ffffc7e:
    puVar7 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.oneof_field_.oneof_test_all_types_ & 0xfffffffffffffffc)
    ;
    pcVar13 = (char *)*puVar7;
    sVar14 = puVar7[1];
    uVar15 = 0x1ffffc7e;
LAB_001cdafe:
    s_01._M_str = pcVar13;
    s_01._M_len = sVar14;
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,uVar15,s_01,target);
  }
  uVar9 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar9 & 1) != 0) {
    uVar9 = uVar9 & 0xfffffffffffffffe;
    data = *(void **)(uVar9 + 8);
    uVar19 = *(uint *)(uVar9 + 0x10);
    if ((long)stream->end_ - (long)target < (long)(int)uVar19) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,uVar19,target);
    }
    else {
      memcpy(target,data,(ulong)uVar19);
      target = target + (int)uVar19;
    }
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestHugeFieldNumbersLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestHugeFieldNumbersLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestHugeFieldNumbersLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 optional_int32 = 536870000;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        536870000, this_._internal_optional_int32(), target);
  }

  // int32 fixed_32 = 536870001;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        536870001, this_._internal_fixed_32(), target);
  }

  // repeated int32 repeated_int32 = 536870002;
  for (int i = 0, n = this_._internal_repeated_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        536870002, this_._internal_repeated_int32().Get(i), target);
  }

  // repeated int32 packed_int32 = 536870003 [features = {
  {
    int byte_size = this_._impl_._packed_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          536870003, this_._internal_packed_int32(), byte_size, target);
    }
  }

  // .proto2_unittest.ForeignEnumLite optional_enum = 536870004;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        536870004, this_._internal_optional_enum(), target);
  }

  // string optional_string = 536870005;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_optional_string();
    target = stream->WriteStringMaybeAliased(536870005, _s, target);
  }

  // bytes optional_bytes = 536870006;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_optional_bytes();
    target = stream->WriteBytesMaybeAliased(536870006, _s, target);
  }

  // .proto2_unittest.ForeignMessageLite optional_message = 536870007;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        536870007, *this_._impl_.optional_message_, this_._impl_.optional_message_->GetCachedSize(), target,
        stream);
  }

  // .proto2_unittest.TestHugeFieldNumbersLite.OptionalGroup optionalgroup = 536870008 [features = {
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        536870008, *this_._impl_.optionalgroup_, target, stream);
  }

  // map<string, string> string_string_map = 536870010;
  if (!this_._internal_string_string_map().empty()) {
    using MapType = ::google::protobuf::Map<std::string, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<std::string, std::string,
                                   _pbi::WireFormatLite::TYPE_STRING,
                                   _pbi::WireFormatLite::TYPE_STRING>;
    const auto& field = this_._internal_string_string_map();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterPtr<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            536870010, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            536870010, entry.first, entry.second, target, stream);
      }
    }
  }

  switch (this_.oneof_field_case()) {
    case kOneofUint32: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
          536870011, this_._internal_oneof_uint32(), target);
      break;
    }
    case kOneofTestAllTypes: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          536870012, *this_._impl_.oneof_field_.oneof_test_all_types_, this_._impl_.oneof_field_.oneof_test_all_types_->GetCachedSize(), target,
          stream);
      break;
    }
    case kOneofString: {
      const ::std::string& _s = this_._internal_oneof_string();
      target = stream->WriteStringMaybeAliased(536870013, _s, target);
      break;
    }
    case kOneofBytes: {
      const ::std::string& _s = this_._internal_oneof_bytes();
      target = stream->WriteBytesMaybeAliased(536870014, _s, target);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestHugeFieldNumbersLite)
  return target;
}